

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

iter_type __thiscall
booster::locale::impl_icu::num_parse<wchar_t>::do_real_get<unsigned_long>
          (num_parse<wchar_t> *this,iter_type in,iter_type end,ios_base *ios,iostate *err,
          unsigned_long *val)

{
  int *piVar1;
  iter_type iVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int_type iVar5;
  int_type iVar6;
  int iVar7;
  long *plVar8;
  ulong uVar9;
  int_type iVar10;
  streambuf_type *psVar11;
  ulong uVar12;
  iter_type iVar13;
  iter_type iVar14;
  iter_type __beg;
  string_type tmp;
  cast_type value;
  
  iVar13._M_sbuf = end._M_sbuf;
  psVar11 = in._M_sbuf;
  iVar6 = in._M_c;
  plVar8 = (long *)__dynamic_cast(ios,&std::ios_base::typeinfo,&std::wistream::typeinfo,
                                  0xffffffffffffffff);
  iVar10 = end._M_c;
  if (((plVar8 == (long *)0x0) || (bVar4 = num_base::use_parent<unsigned_long>(ios,0), bVar4)) ||
     (formatter<wchar_t>::create((formatter<wchar_t> *)&tmp,ios,&this->loc_,&this->enc_),
     _Var3 = tmp._M_dataplus, tmp._M_dataplus._M_p == (pointer)0x0)) {
    __beg._12_4_ = 0;
    __beg._M_sbuf = (streambuf_type *)SUB128(in._0_12_,0);
    __beg._M_c = SUB124(in._0_12_,8);
    iVar13._8_8_ = end._8_8_ & 0xffffffff;
    iVar13 = std::num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>::
             _M_extract_int_abi_cxx11_<unsigned_long>
                       ((num_get<wchar_t,std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
                         *)this,__beg,iVar13,ios,err,val);
    iVar14._M_sbuf = iVar13._M_sbuf;
    iVar14._M_c = iVar13._M_c;
    iVar14._12_4_ = iVar13._12_4_;
    return iVar14;
  }
  tmp._M_string_length = 0;
  tmp.field_2._M_local_buf[0] = L'\0';
  tmp._M_dataplus._M_p = (pointer)&tmp.field_2;
  std::__cxx11::wstring::reserve((ulong)&tmp);
LAB_00193a79:
  iVar5 = iVar6;
  if (iVar6 == 0xffffffff && psVar11 != (streambuf_type *)0x0) {
    if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
      iVar5 = **(int_type **)(psVar11 + 0x10);
    }
    else {
      iVar5 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
    }
    if (iVar5 == 0xffffffff) {
      psVar11 = (streambuf_type *)0x0;
    }
  }
  if (iVar13._M_sbuf == (streambuf_type *)0x0 || iVar10 != 0xffffffff) {
    if ((iVar10 == 0xffffffff) == (iVar5 == 0xffffffff)) goto LAB_00193cf6;
  }
  else {
    if (*(int **)(iVar13._M_sbuf + 0x10) < *(int **)(iVar13._M_sbuf + 0x18)) {
      iVar7 = **(int **)(iVar13._M_sbuf + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)iVar13._M_sbuf + 0x48))(iVar13._M_sbuf);
    }
    if (iVar7 == -1) {
      iVar13._M_sbuf = (streambuf_type *)0x0;
      if (iVar5 == 0xffffffff) goto LAB_00193cf6;
    }
    else if (iVar5 != 0xffffffff) goto LAB_00193cf6;
  }
  iVar5 = iVar6;
  if (psVar11 != (streambuf_type *)0x0 && iVar6 == 0xffffffff) {
    if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
      iVar5 = **(int_type **)(psVar11 + 0x10);
    }
    else {
      iVar5 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
    }
    if (iVar5 == 0xffffffff) {
      psVar11 = (streambuf_type *)0x0;
    }
  }
  if (iVar5 != 0x7f && 0x1f < iVar5 - 1) goto LAB_00193cf6;
  if (*(ulong *)(psVar11 + 0x10) < *(ulong *)(psVar11 + 0x18)) {
    *(ulong *)(psVar11 + 0x10) = *(ulong *)(psVar11 + 0x10) + 4;
    iVar6 = 0xffffffff;
  }
  else {
    iVar6 = 0xffffffff;
    (**(code **)(*(long *)psVar11 + 0x50))(psVar11);
  }
  goto LAB_00193a79;
LAB_00193cf6:
  if (0xfff < tmp._M_string_length) goto LAB_00193d05;
  iVar5 = iVar6;
  if (iVar6 == 0xffffffff && psVar11 != (streambuf_type *)0x0) {
    if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
      iVar5 = **(int_type **)(psVar11 + 0x10);
    }
    else {
      iVar5 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
    }
    if (iVar5 == 0xffffffff) {
      psVar11 = (streambuf_type *)0x0;
    }
  }
  if (iVar13._M_sbuf == (streambuf_type *)0x0 || iVar10 != 0xffffffff) {
    if ((iVar10 == 0xffffffff) == (iVar5 == 0xffffffff)) goto LAB_00193d05;
  }
  else {
    if (*(int **)(iVar13._M_sbuf + 0x10) < *(int **)(iVar13._M_sbuf + 0x18)) {
      iVar7 = **(int **)(iVar13._M_sbuf + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)iVar13._M_sbuf + 0x48))(iVar13._M_sbuf);
    }
    if (iVar7 == -1) {
      iVar13._M_sbuf = (streambuf_type *)0x0;
      if (iVar5 == 0xffffffff) goto LAB_00193d05;
    }
    else if (iVar5 != 0xffffffff) goto LAB_00193d05;
  }
  if (psVar11 == (streambuf_type *)0x0 || iVar6 != 0xffffffff) {
LAB_00193c5e:
    if (iVar6 == 10) goto LAB_00193d05;
  }
  else {
    if (*(int_type **)(psVar11 + 0x10) < *(int_type **)(psVar11 + 0x18)) {
      iVar6 = **(int_type **)(psVar11 + 0x10);
    }
    else {
      iVar6 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
    }
    if (iVar6 != 0xffffffff) goto LAB_00193c5e;
    psVar11 = (streambuf_type *)0x0;
  }
  piVar1 = *(int **)(psVar11 + 0x10);
  if (piVar1 < *(int **)(psVar11 + 0x18)) {
    iVar7 = *piVar1;
    *(int **)(psVar11 + 0x10) = piVar1 + 1;
  }
  else {
    iVar7 = (**(code **)(*(long *)psVar11 + 0x50))(psVar11);
  }
  if ((iVar7 == -1) && (*(ulong *)(psVar11 + 0x18) <= *(ulong *)(psVar11 + 0x10))) {
    (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
  }
  iVar6 = 0xffffffff;
  std::__cxx11::wstring::push_back((wchar_t)&tmp);
  goto LAB_00193cf6;
LAB_00193d05:
  uVar9 = (**(code **)(*(long *)_Var3._M_p + 0x30))(_Var3._M_p,&tmp,&value);
  uVar12 = tmp._M_string_length;
  if ((uVar9 == 0) || (value < 0)) {
    *(undefined1 *)err = (char)*err | _S_failbit;
  }
  else {
    *val = value;
  }
  for (; uVar9 < uVar12; uVar12 = uVar12 - 1) {
    std::wistream::putback((wchar_t)plVar8);
  }
  psVar11 = *(streambuf_type **)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0xe8);
  if (psVar11 == (streambuf_type *)0x0) {
    bVar4 = true;
    psVar11 = (streambuf_type *)0x0;
  }
  else {
    if (*(int **)(psVar11 + 0x10) < *(int **)(psVar11 + 0x18)) {
      iVar7 = **(int **)(psVar11 + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)psVar11 + 0x48))(psVar11);
    }
    bVar4 = iVar7 == -1;
    if (bVar4) {
      psVar11 = (streambuf_type *)0x0;
    }
  }
  if (iVar13._M_sbuf == (streambuf_type *)0x0 || iVar10 != 0xffffffff) {
    if ((iVar10 != 0xffffffff) == bVar4) goto LAB_00193e14;
  }
  else {
    if (*(int **)(iVar13._M_sbuf + 0x10) < *(int **)(iVar13._M_sbuf + 0x18)) {
      iVar7 = **(int **)(iVar13._M_sbuf + 0x10);
    }
    else {
      iVar7 = (**(code **)(*(long *)iVar13._M_sbuf + 0x48))(iVar13._M_sbuf);
    }
    if (bVar4 != (iVar7 == -1)) goto LAB_00193e14;
  }
  *(undefined1 *)err = (char)*err | _S_eofbit;
LAB_00193e14:
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)tmp._M_dataplus._M_p != &tmp.field_2) {
    operator_delete(tmp._M_dataplus._M_p);
  }
  (**(code **)(*(long *)_Var3._M_p + 8))(_Var3._M_p);
  iVar2._8_8_ = 0xffffffff;
  iVar2._M_sbuf = psVar11;
  return iVar2;
}

Assistant:

iter_type do_real_get(iter_type in,iter_type end,std::ios_base &ios,std::ios_base::iostate &err,ValueType &val) const
    {
        formatter_ptr formatter;
        stream_type *stream_ptr = dynamic_cast<stream_type *>(&ios);

        if(!stream_ptr || use_parent<ValueType>(ios,0) || (formatter = formatter_type::create(ios,loc_,enc_)).get()==0) {
            return std::num_get<CharType>::do_get(in,end,ios,err,val);
        }

        typedef typename details::cast_traits<ValueType>::cast_type cast_type;
        string_type tmp;
        tmp.reserve(64);

        CharType c;
        while(in!=end && (((c=*in)<=32 && (c>0)) || c==127)) // Assuming that ASCII is a subset
            ++in;

        while(tmp.size() < 4096 && in!=end && *in!='\n') {
            tmp += *in++;
        }

        cast_type value;
        size_t parsed_chars;

        if((parsed_chars = formatter->parse(tmp,value))==0 || !valid<ValueType>(value)) {
            err |= std::ios_base::failbit;
        }
        else {
            val=static_cast<ValueType>(value);
        }

        for(size_t n=tmp.size();n>parsed_chars;n--) {
            stream_ptr->putback(tmp[n-1]);
        }

        in = iter_type(*stream_ptr);

        if(in==end)
            err |=std::ios_base::eofbit;
        return in;
    }